

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O2

Gia_Man_t * Gia_ManReduceEquiv(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int *pCi2Lit;
  void *__s;
  Gia_Obj_t *pObj;
  ulong uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  int local_48;
  int local_44;
  
  iVar6 = 0;
  while ((iVar6 < p->nRegs &&
         (pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar6), pGVar4 != (Gia_Obj_t *)0x0))) {
    pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value = 0;
    iVar6 = iVar6 + 1;
  }
  iVar6 = 1;
  iVar7 = 0;
  while ((iVar7 < p->nRegs &&
         (pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
    uVar5 = (ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff);
    if (pGVar4[-uVar5].Value == 0) {
      pGVar4[-uVar5].Value = iVar6 * 2;
      iVar6 = iVar6 + 1;
    }
    iVar7 = iVar7 + 1;
  }
  sVar8 = (long)p->vCis->nSize << 2;
  pCi2Lit = (int *)malloc(sVar8);
  memset(pCi2Lit,0xff,sVar8);
  sVar8 = (long)(iVar6 * 2) << 2;
  __s = malloc(sVar8);
  memset(__s,0xff,sVar8);
  iVar6 = 0;
  local_44 = 0;
  local_48 = 0;
  while (((iVar6 < p->nRegs &&
          (pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar6), pGVar4 != (Gia_Obj_t *)0x0))
         && (pObj = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6), pObj != (Gia_Obj_t *)0x0))) {
    uVar2 = *(undefined8 *)pGVar4;
    uVar1 = pGVar4[-(ulong)((uint)uVar2 & 0x1fffffff)].Value;
    if ((int)uVar1 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar3 = Gia_ObjId(p,pGVar4);
    if ((*(uint *)pGVar4 & 0x20000000) == 0 && (*(uint *)pGVar4 & 0x1fffffff) == uVar3) {
      pCi2Lit[(p->vCis->nSize - p->nRegs) + iVar6] = 0;
      local_44 = local_44 + 1;
    }
    else {
      uVar5 = (ulong)((uint)uVar2 >> 0x1d & 1 ^ uVar1);
      iVar7 = *(int *)((long)__s + uVar5 * 4);
      if (iVar7 == -1) {
        iVar7 = Gia_ObjId(p,pObj);
        if (iVar7 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        *(int *)((long)__s + uVar5 * 4) = iVar7 * 2;
      }
      else {
        pCi2Lit[(p->vCis->nSize - p->nRegs) + iVar6] = iVar7;
        local_48 = local_48 + 1;
      }
    }
    iVar6 = iVar6 + 1;
  }
  free(__s);
  if (local_44 != 0 || local_48 != 0) {
    p = Gia_ManDupDfsCiMap(p,pCi2Lit,(Vec_Int_t *)0x0);
  }
  free(pCi2Lit);
  return p;
}

Assistant:

Gia_Man_t * Gia_ManReduceEquiv( Gia_Man_t * p, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObjRi, * pObjRo;
    unsigned * pCi2Lit, * pMaps;
    int i, iLit, nFanins = 1, Counter0 = 0, Counter = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        Gia_ObjFanin0(pObjRi)->Value = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        if ( Gia_ObjFanin0(pObjRi)->Value == 0 )
            Gia_ObjFanin0(pObjRi)->Value = 2*nFanins++;
    pCi2Lit = ABC_FALLOC( unsigned, Gia_ManCiNum(p) );
    pMaps   = ABC_FALLOC( unsigned, 2 * nFanins );
    Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
    {
        iLit = Gia_ObjFanin0Copy( pObjRi );
        if ( Gia_ObjFaninId0p(p, pObjRi) == 0 && Gia_ObjFaninC0(pObjRi) == 0 ) // const 0 
            pCi2Lit[Gia_ManPiNum(p)+i] = 0, Counter0++;
        else if ( ~pMaps[iLit] ) // in this case, ID(pObj) > ID(pRepr) 
            pCi2Lit[Gia_ManPiNum(p)+i] = pMaps[iLit], Counter++; 
        else
            pMaps[iLit] = Abc_Var2Lit( Gia_ObjId(p, pObjRo), 0 );
    }
/*
    Gia_ManForEachCi( p, pObjRo, i )
    {
        if ( ~pCi2Lit[i] )
        {
            Gia_Obj_t * pObj0 = Gia_ObjRoToRi(p, pObjRo);
            Gia_Obj_t * pObj1 = Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i]));
            Gia_Obj_t * pFan0 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, pObjRo) );
            Gia_Obj_t * pFan1 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i])) );
            assert( pFan0 == pFan1 );
        }
    }
*/
//    if ( fVerbose )
//        printf( "ReduceEquiv detected %d constant regs and %d equivalent regs.\n", Counter0, Counter );
    ABC_FREE( pMaps );
    if ( Counter0 || Counter )
        pNew = Gia_ManDupDfsCiMap( p, (int *)pCi2Lit, NULL );
    else
        pNew = p;
    ABC_FREE( pCi2Lit );
    return pNew;
}